

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info,string *warn,string *err)

{
  string *psVar1;
  char *__s;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ostream *poVar7;
  EXRChannelInfo *pEVar8;
  int *piVar9;
  EXRAttribute *pEVar10;
  int *piVar11;
  size_t __n;
  size_t i;
  long lVar12;
  long lVar13;
  ulong uVar14;
  pointer pTVar15;
  pointer pTVar16;
  stringstream ss;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  iVar4 = (info->display_window).min_y;
  iVar2 = (info->display_window).max_x;
  iVar3 = (info->display_window).max_y;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = iVar4;
  (exr_header->display_window).max_x = iVar2;
  (exr_header->display_window).max_y = iVar3;
  iVar4 = (info->data_window).min_y;
  iVar2 = (info->data_window).max_x;
  iVar3 = (info->data_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = iVar4;
  (exr_header->data_window).max_x = iVar2;
  (exr_header->data_window).max_y = iVar3;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  iVar4 = info->tile_size_x;
  iVar2 = info->tile_size_y;
  iVar3 = info->tile_level_mode;
  exr_header->tiled = info->tiled;
  exr_header->tile_size_x = iVar4;
  exr_header->tile_size_y = iVar2;
  exr_header->tile_level_mode = iVar3;
  exr_header->tile_rounding_mode = info->tile_rounding_mode;
  __s = (info->name)._M_dataplus._M_p;
  memset(exr_header->name,0,0x100);
  if ((__s != (char *)0x0) && (sVar6 = strlen(__s), sVar6 != 0)) {
    __n = 0xff;
    if (sVar6 < 0xff) {
      __n = sVar6;
    }
    memcpy(exr_header->name,__s,__n);
  }
  if ((info->type)._M_string_length != 0) {
    psVar1 = &info->type;
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 == 0) {
      if (exr_header->tiled != 0) goto joined_r0x00106176;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        iVar4 = exr_header->tiled;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar4 == 0) {
            exr_header->non_image = 1;
            if ((err != (string *)0x0) && (exr_header->tiled != 0)) {
              std::__cxx11::string::append((char *)err);
            }
          }
          else if (warn != (string *)0x0) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"(ConvertHeader) Unsupported or unknown info.type: ",0x32);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(info->type)._M_dataplus._M_p,
                                (info->type)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)warn,(ulong)local_1d8);
            if (local_1d8 != local_1c8) {
              operator_delete(local_1d8);
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
          }
          goto LAB_001061de;
        }
        exr_header->non_image = 1;
        iVar4 = exr_header->tiled;
      }
      if (iVar4 == 0) {
joined_r0x00106176:
        if (err != (string *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
        return false;
      }
    }
  }
LAB_001061de:
  pTVar15 = (info->channels).
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((long)(info->channels).
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar15 >> 3) * -0x49249249
  ;
  exr_header->num_channels = iVar4;
  pEVar8 = (EXRChannelInfo *)malloc((long)iVar4 * 0x110);
  exr_header->channels = pEVar8;
  if (iVar4 == 0) {
    iVar4 = 0;
    sVar6 = 0;
  }
  else {
    lVar13 = 0;
    lVar12 = 0;
    uVar14 = 0;
    do {
      strncpy(pEVar8->name + lVar12,*(char **)(pTVar15->pad + lVar13 + -0x31),0xff);
      exr_header->channels->pad[lVar12 + -0xe] = '\0';
      pTVar15 = (info->channels).
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar8 = exr_header->channels;
      *(undefined4 *)(pEVar8->pad + lVar12 + -0xd) =
           *(undefined4 *)(pTVar15->pad + lVar13 + 0xffffffffffffffef);
      pEVar8->pad[lVar12 + -1] = pTVar15->pad[lVar13 + 0xffffffffffffffff];
      *(undefined8 *)(pEVar8->pad + lVar12 + -9) =
           *(undefined8 *)(pTVar15->pad + lVar13 + 0xfffffffffffffff7);
      uVar14 = uVar14 + 1;
      iVar4 = exr_header->num_channels;
      lVar12 = lVar12 + 0x110;
      lVar13 = lVar13 + 0x38;
    } while (uVar14 < (ulong)(long)iVar4);
    sVar6 = (long)iVar4 << 2;
  }
  piVar9 = (int *)malloc(sVar6);
  exr_header->pixel_types = piVar9;
  if (iVar4 == 0) {
    piVar9 = (int *)malloc(0);
    exr_header->requested_pixel_types = piVar9;
  }
  else {
    lVar13 = (long)iVar4;
    piVar11 = &pTVar15->pixel_type;
    lVar12 = 0;
    do {
      piVar9[lVar12] = *piVar11;
      lVar12 = lVar12 + 1;
      piVar11 = piVar11 + 0xe;
    } while (lVar13 != lVar12);
    piVar9 = (int *)malloc(lVar13 * 4);
    exr_header->requested_pixel_types = piVar9;
    if (iVar4 != 0) {
      piVar11 = &pTVar15->pixel_type;
      lVar12 = 0;
      do {
        piVar9[lVar12] = *piVar11;
        lVar12 = lVar12 + 1;
        piVar11 = piVar11 + 0xe;
      } while (lVar13 != lVar12);
    }
  }
  pTVar16 = (info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (int)((long)(info->attributes).
                      super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pTVar16 >> 4) * 0x3e0f83e1;
  exr_header->num_custom_attributes = uVar5;
  if ((int)uVar5 < 1) {
    exr_header->custom_attributes = (EXRAttribute *)0x0;
  }
  else {
    if (0x80 < uVar5) {
      exr_header->num_custom_attributes = 0x80;
      uVar5 = 0x80;
    }
    pEVar10 = (EXRAttribute *)malloc((ulong)(uVar5 & 0x7fffffff) * 0x210);
    exr_header->custom_attributes = pEVar10;
    lVar12 = 0;
    uVar14 = 0;
    do {
      memcpy(pEVar10->name + lVar12,pTVar16->name + lVar12,0x100);
      memcpy(exr_header->custom_attributes->type + lVar12,
             ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start)->type + lVar12,0x100);
      pTVar16 = (info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar10 = exr_header->custom_attributes;
      *(undefined4 *)((long)&pEVar10->size + lVar12) =
           *(undefined4 *)((long)&pTVar16->size + lVar12);
      *(undefined8 *)((long)&pEVar10->value + lVar12) =
           *(undefined8 *)((long)&pTVar16->value + lVar12);
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x210;
    } while (uVar14 < (ulong)(long)exr_header->num_custom_attributes);
  }
  exr_header->header_len = info->header_len;
  return true;
}

Assistant:

static bool ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info, std::string *warn, std::string *err) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;
  exr_header->tiled = info.tiled;
  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  EXRSetNameAttr(exr_header, info.name.c_str());


  if (!info.type.empty()) {
    bool valid = true;
    if (info.type == "scanlineimage") {
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "tiledimage") {
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `tiledimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deeptile") {
      exr_header->non_image = 1;
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `deeptile` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deepscanline") {
      exr_header->non_image = 1;
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `deepscanline` type.\n";
        }
        //valid = false;
      }
    } else {
      if (warn) {
        std::stringstream ss;
        ss << "(ConvertHeader) Unsupported or unknown info.type: " << info.type << "\n";
        (*warn) += ss.str();
      }
    }

    if (!valid) {
      return false;
    }
  }

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < size_t(exr_header->num_custom_attributes); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;

  return true;
}